

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::anon_unknown_0::TableDrivenEnabled
               (Descriptor *descriptor,Options *options)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  if (options->table_driven_parsing != true) {
    return false;
  }
  if ((*(int *)(descriptor + 0x68) == 0) &&
     (((options->enforce_lite != false ||
       (*(int *)(*(long *)(*(long *)(descriptor + 0x10) + 0xa0) + 0xa8) == 3)) &&
      (iVar6 = 0, *(int *)(*(long *)(descriptor + 0x10) + 0x8c) != 3)))) {
    lVar7 = -1;
    lVar5 = 0;
    while( true ) {
      lVar7 = lVar7 + 1;
      if (*(int *)(descriptor + 0x2c) <= lVar7) break;
      lVar3 = *(long *)(descriptor + 0x30);
      iVar2 = *(int *)(lVar3 + 0x38 + lVar5);
      if (iVar6 <= iVar2) {
        iVar6 = iVar2;
      }
      bVar4 = FieldDescriptor::is_map((FieldDescriptor *)(lVar5 + lVar3));
      if (bVar4) {
        return false;
      }
      if (*(long *)(lVar3 + 0x60 + lVar5) != 0) {
        return false;
      }
      plVar1 = (long *)(lVar3 + 0x80 + lVar5);
      lVar5 = lVar5 + 0xa8;
      if (*(char *)(*plVar1 + 0x6f) != '\0') {
        return false;
      }
    }
    if ((iVar6 < 0x8000) && ((double)iVar6 * 0.5 < (double)*(int *)(descriptor + 0x2c))) {
      return (bool)(*(byte *)(*(long *)(descriptor + 0x20) + 0x6b) ^ 1);
    }
  }
  return false;
}

Assistant:

bool TableDrivenEnabled(const Descriptor* descriptor, const Options& options) {
  if (!options.table_driven_parsing) {
    return false;
  }

  // Consider table-driven parsing.  We only do this if:
  // - There are no extensions
  if (descriptor->extension_range_count() != 0) {
    return false;
  }

  // - We are not using UnknownFieldSet (part of the non-lite library).
  if (UseUnknownFieldSet(descriptor->file(), options)) {
    return false;
  }

  // - We have has_bits for fields.  This avoids a check on every field we set
  //   when are present (the common case).
  if (!HasFieldPresence(descriptor->file())) {
    return false;
  }

  const double table_sparseness = 0.5;
  int max_field_number = 0;
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    if (max_field_number < field->number()) {
      max_field_number = field->number();
    }

    // - There are no map fields.
    if (field->is_map()) {
      return false;
    }

    // - There are no oneof fields.
    if (field->containing_oneof()) {
      return false;
    }

    // - There are no weak fields.
    if (field->options().weak()) {
      return false;
    }
  }

  // - There range of field numbers is "small"
  if (max_field_number >= (2 << 14)) {
    return false;
  }

  // - Field numbers are relatively dense within the actual number of fields
  if (max_field_number * table_sparseness >= descriptor->field_count()) {
    return false;
  }

  // - This is not a MapEntryMessage.
  if (IsMapEntryMessage(descriptor)) {
    return false;
  }

  return true;
}